

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  bool bVar1;
  CommandOptions *__s1;
  int iVar2;
  _List_node_base *p_Var3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char *__format;
  CommandOptions *this_00;
  int iVar7;
  allocator<char> local_61;
  _List_node_base *local_60;
  CommandOptions *local_58;
  _List_node_base *local_50;
  bool local_48;
  undefined7 uStack_47;
  _List_node_base *p_Stack_40;
  _List_node_base *local_38;
  
  this->error_flag = true;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  local_60 = (_List_node_base *)&this->filenames;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_60;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_60;
  this->max_bitrate = 0.0;
  (this->filenames).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  *(undefined8 *)
   ((long)&(this->filenames).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size + 7) = 0;
  this_00 = this;
  if (1 < argc) {
    local_38 = (_List_node_base *)
               &(this->filenames).
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl._M_node._M_size;
    iVar7 = 1;
    do {
      __s1 = (CommandOptions *)argv[iVar7];
      this_00 = __s1;
      iVar2 = strcmp((char *)__s1,"-help");
      if (iVar2 == 0) {
switchD_0010cc19_caseD_68:
        this->help_flag = true;
      }
      else if (__s1->error_flag == true) {
        bVar1 = __s1->version_flag;
        uVar6 = (uint)bVar1;
        this_00 = (CommandOptions *)(ulong)uVar6;
        iVar2 = isalpha(uVar6);
        if ((9 < uVar6 - 0x30 && iVar2 == 0) || (__s1->help_flag != false)) {
          __format = "Unrecognized argument: %s\n";
          goto LAB_0010cdc6;
        }
        switch(bVar1) {
        case true:
          this->showcoding_flag = true;
          break;
        case true:
          this->showdescriptor_flag = true;
          break;
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
        case true:
switchD_0010cc19_caseD_65:
          __format = "Unrecognized option: %s\n";
LAB_0010cdc6:
          fprintf(_stderr,__format,__s1);
          return;
        case true:
          goto switchD_0010cc19_caseD_68;
        case true:
          this->showid_flag = true;
          break;
        case true:
          this->showindex_flag = true;
          break;
        case true:
          this->showrate_flag = true;
          break;
        case true:
          iVar7 = iVar7 + 1;
          if ((argc <= iVar7) ||
             (this_00 = (CommandOptions *)argv[iVar7], this_00->error_flag == true)) {
            CommandOptions(this_00);
            return;
          }
          lVar4 = strtol((char *)this_00,(char **)0x0,10);
          lVar5 = -lVar4;
          if (0 < lVar4) {
            lVar5 = lVar4;
          }
          this->max_bitrate = (double)lVar5;
          this->max_bitrate_flag = true;
          break;
        case true:
          this->verbose_flag = true;
          break;
        default:
          if (bVar1 == true) {
            this->showheader_flag = true;
          }
          else {
            if (bVar1 != true) goto switchD_0010cc19_caseD_65;
            this->version_flag = true;
          }
        }
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,(char *)__s1,&local_61);
        p_Var3 = (_List_node_base *)operator_new(0x30);
        p_Var3[1]._M_next = p_Var3 + 2;
        if (local_58 == (CommandOptions *)&local_48) {
          p_Var3[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
          p_Var3[2]._M_prev = p_Stack_40;
        }
        else {
          p_Var3[1]._M_next = (_List_node_base *)local_58;
          p_Var3[2]._M_next = (_List_node_base *)CONCAT71(uStack_47,local_48);
        }
        p_Var3[1]._M_prev = local_50;
        local_50 = (_List_node_base *)0x0;
        local_48 = false;
        local_58 = (CommandOptions *)&local_48;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        local_38->_M_next = (_List_node_base *)((long)&local_38->_M_next->_M_next + 1);
        this_00 = local_58;
        if (local_58 != (CommandOptions *)&local_48) {
          operator_delete(local_58,CONCAT71(uStack_47,local_48) + 1);
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < argc);
    if ((this->help_flag & 1U) != 0) {
      return;
    }
  }
  if (this->version_flag == false) {
    if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&local_60->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_60) {
      CommandOptions(this_00);
    }
    else {
      this->error_flag = false;
    }
  }
  return;
}

Assistant:

CommandOptions(int argc, const char** argv) :
    error_flag(true), version_flag(false), help_flag(false), verbose_flag(false),
    showindex_flag(false), showheader_flag(false),
    showid_flag(false), showdescriptor_flag(false), showcoding_flag(false),
    showrate_flag(false), max_bitrate_flag(false), max_bitrate(0.0)
  {
    for ( int i = 1; i < argc; ++i )
      {

	if ( (strcmp( argv[i], "-help") == 0) )
	  {
	    help_flag = true;
	    continue;
	  }

	if ( argv[i][0] == '-'
	     && ( isalpha(argv[i][1]) || isdigit(argv[i][1]) )
	     && argv[i][2] == 0 )
	  {
	    switch ( argv[i][1] )
	      {
	      case 'c': showcoding_flag = true; break;
	      case 'd': showdescriptor_flag = true; break;
	      case 'H': showheader_flag = true; break;
	      case 'h': help_flag = true; break;
	      case 'i': showid_flag = true; break;
	      case 'n': showindex_flag = true; break;
	      case 'r': showrate_flag = true; break;

	      case 't':
		TEST_EXTRA_ARG(i, 't');
		max_bitrate = Kumu::xabs(strtol(argv[i], 0, 10));
		max_bitrate_flag = true;
		break;

	      case 'V': version_flag = true; break;
	      case 'v': verbose_flag = true; break;

	      default:
		fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		return;
	      }
	  }
	else
	  {
	    if ( argv[i][0] != '-' )
	      {
		filenames.push_back(argv[i]);
	      }
	    else
	      {
		fprintf(stderr, "Unrecognized argument: %s\n", argv[i]);
		return;
	      }
	  }
      }

    if ( help_flag || version_flag )
      return;

    if ( filenames.empty() )
      {
	fputs("At least one filename argument is required.\n", stderr);
	return;
      }

    error_flag = false;
  }